

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

int __thiscall
semver::detail::prerelease_comparator::compare<int,int,int>
          (prerelease_comparator *this,version<int,_int,_int> *lhs,version<int,_int,_int> *rhs)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  ppVar1 = (lhs->prerelease_identifiers).
           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (lhs->prerelease_identifiers).
           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (rhs->prerelease_identifiers).
           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (rhs->prerelease_identifiers).
           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppVar1 == ppVar2) == (ppVar3 == ppVar4)) {
    uVar6 = ((long)ppVar2 - (long)ppVar1) / 0x28;
    uVar7 = ((long)ppVar4 - (long)ppVar3) / 0x28;
    if (uVar7 < uVar6) {
      uVar6 = uVar7;
    }
    lVar9 = uVar6 + 1;
    lVar8 = 0;
    do {
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) {
        return (int)(((long)(rhs->prerelease_identifiers).
                            super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(rhs->prerelease_identifiers).
                           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                           ._M_impl.super__Vector_impl_data._M_start) / -0x28) +
               (int)(((long)(lhs->prerelease_identifiers).
                            super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(lhs->prerelease_identifiers).
                           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      }
      iVar5 = compare_identifier(this,(prerelease_identifier *)
                                      ((long)&((lhs->prerelease_identifiers).
                                               super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->type +
                                      lVar8),
                                 (prerelease_identifier *)
                                 ((long)&((rhs->prerelease_identifiers).
                                          super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->type + lVar8))
      ;
      lVar8 = lVar8 + 0x28;
    } while (iVar5 == 0);
  }
  else {
    iVar5 = (int)(((long)ppVar2 - (long)ppVar1) / -0x28) +
            (int)(((long)ppVar4 - (long)ppVar3) / 0x28);
  }
  return iVar5;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR int compare(const version<I1, I2, I3>& lhs, const version<I1, I2, I3>& rhs) const noexcept {
    if (lhs.prerelease_identifiers.empty() != rhs.prerelease_identifiers.empty()) {
      return static_cast<int>(rhs.prerelease_identifiers.size()) - static_cast<int>(lhs.prerelease_identifiers.size());
    }

    const std::size_t count = std::min(lhs.prerelease_identifiers.size(), rhs.prerelease_identifiers.size());

    for (std::size_t i = 0; i < count; ++i) {
      const int compare_result = compare_identifier(lhs.prerelease_identifiers[i], rhs.prerelease_identifiers[i]);
      if (compare_result != 0) {
        return compare_result;
      }
    }

    return static_cast<int>(lhs.prerelease_identifiers.size()) - static_cast<int>(rhs.prerelease_identifiers.size());
  }